

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::Runner::sectionStarted
          (Runner *this,string *name,string *description,SourceLineInfo *lineInfo,Counts *assertions
          )

{
  RunningTest *this_00;
  bool bVar1;
  ostream *poVar2;
  IReporter *pIVar3;
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream oss;
  Counts *assertions_local;
  SourceLineInfo *lineInfo_local;
  string *description_local;
  string *name_local;
  Runner *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar2 = std::operator<<((ostream *)local_1b0,(string *)name);
  poVar2 = std::operator<<(poVar2,"@");
  Catch::operator<<(poVar2,lineInfo);
  this_00 = this->m_runningTest;
  std::__cxx11::ostringstream::str();
  bVar1 = RunningTest::addSection(this_00,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  bVar1 = ((bVar1 ^ 0xffU) & 1) == 0;
  if (bVar1) {
    SourceLineInfo::operator=(&(this->m_lastAssertionInfo).lineInfo,lineInfo);
    pIVar3 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
    (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])(pIVar3,name,description);
    assertions->passed = (this->m_totals).assertions.passed;
    assertions->failed = (this->m_totals).assertions.failed;
  }
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return bVar1;
}

Assistant:

virtual bool sectionStarted (
            const std::string& name,
            const std::string& description,
            const SourceLineInfo& lineInfo,
            Counts& assertions
        )
        {
            std::ostringstream oss;
            oss << name << "@" << lineInfo;

            if( !m_runningTest->addSection( oss.str() ) )
                return false;

            m_lastAssertionInfo.lineInfo = lineInfo;

            m_reporter->StartSection( name, description );
            assertions = m_totals.assertions;

            return true;
        }